

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_barrier_(lua_State *L,GCObject *o,GCObject *v)

{
  global_State *g_00;
  global_State *g;
  GCObject *v_local;
  GCObject *o_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if (g_00->gcstate < 3) {
    reallymarkobject(g_00,v);
    if (1 < (o->marked & 7)) {
      v->marked = v->marked & 0xf8 | 2;
    }
  }
  else if (g_00->gckind == '\0') {
    o->marked = o->marked & 199 | g_00->currentwhite & 0x18;
  }
  return;
}

Assistant:

void luaC_barrier_ (lua_State *L, GCObject *o, GCObject *v) {
  global_State *g = G(L);
  lua_assert(isblack(o) && iswhite(v) && !isdead(g, v) && !isdead(g, o));
  if (keepinvariant(g)) {  /* must keep invariant? */
    reallymarkobject(g, v);  /* restore invariant */
    if (isold(o)) {
      lua_assert(!isold(v));  /* white object could not be old */
      setage(v, G_OLD0);  /* restore generational invariant */
    }
  }
  else {  /* sweep phase */
    lua_assert(issweepphase(g));
    if (g->gckind == KGC_INC)  /* incremental mode? */
      makewhite(g, o);  /* mark 'o' as white to avoid other barriers */
  }
}